

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::DOMAttrMapImpl::readOnly(DOMAttrMapImpl *this)

{
  bool bVar1;
  DOMNodeImpl *this_00;
  DOMAttrMapImpl *this_local;
  
  this_00 = xercesc_4_0::castToNodeImpl(this->fOwnerNode);
  bVar1 = DOMNodeImpl::isReadOnly(this_00);
  return bVar1;
}

Assistant:

bool DOMAttrMapImpl::readOnly() {
    return castToNodeImpl(fOwnerNode)->isReadOnly();
}